

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.c
# Opt level: O0

int picnic_timingsafe_bcmp(void *a,void *b,size_t len)

{
  uint res;
  uchar *p2;
  uchar *p1;
  size_t len_local;
  void *b_local;
  void *a_local;
  
  res = 0;
  p2 = (uchar *)b;
  p1 = (uchar *)a;
  for (len_local = len; len_local != 0; len_local = len_local - 1) {
    res = *p1 ^ *p2 | res;
    p1 = p1 + 1;
    p2 = p2 + 1;
  }
  return res;
}

Assistant:

int picnic_timingsafe_bcmp(const void* a, const void* b, size_t len) {
#if defined(HAVE_CONSTTIME_MEMEQUAL)
  return !consttime_memequal(a, b, len);
#else
  const unsigned char* p1 = a;
  const unsigned char* p2 = b;

  unsigned int res = 0;
  for (; len; --len, ++p1, ++p2) {
    res |= *p1 ^ *p2;
  }
  return res;
#endif
}